

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

ssize_t perfetto::base::Base64Decode(char *src,size_t src_size,uint8_t *dst,size_t dst_size)

{
  char cVar1;
  ssize_t sVar2;
  ulong uVar3;
  byte *pbVar4;
  ulong uVar5;
  byte bVar6;
  uint8_t d [4];
  char s [4];
  char local_10 [4];
  byte local_c [4];
  
  sVar2 = -1;
  if ((src_size + 3 >> 2) * 3 <= dst_size) {
    local_c[0] = 0;
    local_c[1] = 0;
    local_c[2] = 0;
    local_c[3] = 0;
    if ((long)src_size < 1) {
      uVar3 = 0;
    }
    else {
      pbVar4 = (byte *)(src + src_size);
      uVar3 = 0;
      do {
        uVar5 = 0;
        do {
          if (src < pbVar4) {
            bVar6 = *src;
            src = (char *)((byte *)src + 1);
          }
          else {
            bVar6 = 0x3d;
            if (uVar5 < 2) {
              bVar6 = 0;
            }
          }
          local_c[uVar5] = bVar6;
          if ((byte)(bVar6 + 0x85) < 0xb0) {
            return -1;
          }
          cVar1 = "N8perfetto8internal20SystemTracingBackendE"[(ulong)bVar6 + 0xd];
          local_10[uVar5] = cVar1;
          if (cVar1 == -1) {
            return -1;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != 4);
        dst[uVar3] = (byte)local_10[1] >> 4 | local_10[0] << 2;
        dst[uVar3 + 1] = (byte)local_10[2] >> 2 | local_10[1] << 4;
        dst[uVar3 + 2] = local_10[2] << 6 | local_10[3];
        uVar3 = uVar3 + 3;
      } while (src < pbVar4);
      if (dst_size < uVar3) {
        Base64Decode();
        return -1;
      }
    }
    sVar2 = (uVar3 - (local_c[3] == '=')) - (ulong)(local_c[2] == '=');
  }
  return sVar2;
}

Assistant:

inline size_t Base64DecSize(size_t src_size) {
  return (src_size + 3) / 4 * 3;
}